

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
IsReusablePropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this,
          int propertyIndex)

{
  bool bVar1;
  int iVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar3;
  SimpleDictionaryPropertyDescriptor<int> *pSVar4;
  byte local_15;
  int propertyIndex_local;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this_local;
  
  local_15 = 0;
  if (-1 < propertyIndex) {
    pBVar3 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
             ::operator->(&(this->
                           super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                           ).propertyMap);
    iVar2 = JsUtil::
            BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
            ::Count(pBVar3);
    local_15 = 0;
    if (propertyIndex < iVar2) {
      pBVar3 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->(&(this->
                             super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                             ).propertyMap);
      pSVar4 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar3,propertyIndex);
      local_15 = 0;
      if (pSVar4->propertyIndex == propertyIndex) {
        bVar1 = TaggedInt::IsOverflow(propertyIndex);
        local_15 = bVar1 ^ 0xff;
      }
    }
  }
  return (bool)(local_15 & 1);
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsReusablePropertyIndex(const TPropertyIndex propertyIndex)
    {
        // When reusing a deleted property index, we will treat the property index as the dictionary index, so they must be the
        // same. Also, property indexes stored in the object's slot corresponding to a deleted property are tagged so that they
        // don't look like pointers. If the property index is too large, it will not be free-listed.
        return
            static_cast<int>(propertyIndex) >= 0 &&
            static_cast<int>(propertyIndex) < this->propertyMap->Count() &&
            this->propertyMap->GetValueAt(propertyIndex).propertyIndex == propertyIndex &&
            !TaggedInt::IsOverflow(propertyIndex);
    }